

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall
polyscope::SurfaceMeshQuantity::SurfaceMeshQuantity
          (SurfaceMeshQuantity *this,string *name,SurfaceMesh *parentStructure,bool dominates)

{
  byte bVar1;
  byte in_CL;
  string *in_RDX;
  QuantityS<polyscope::SurfaceMesh> *in_RSI;
  undefined8 *in_RDI;
  string local_40 [31];
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  std::__cxx11::string::string(local_40,(string *)in_RSI);
  QuantityS<polyscope::SurfaceMesh>::QuantityS
            (in_RSI,in_RDX,(SurfaceMesh *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
             (bool)in_stack_ffffffffffffffdf);
  std::__cxx11::string::~string(local_40);
  *in_RDI = &PTR__SurfaceMeshQuantity_0098c918;
  return;
}

Assistant:

SurfaceMeshQuantity::SurfaceMeshQuantity(std::string name, SurfaceMesh& parentStructure, bool dominates)
    : QuantityS<SurfaceMesh>(name, parentStructure, dominates) {}